

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

ByteData256 * __thiscall
cfd::TransactionContext::CreateSignatureHashByTaproot
          (TransactionContext *this,OutPoint *outpoint,SigHashType *sighash_type,
          ByteData256 *tap_leaf_hash,uint32_t *code_separator_position,ByteData *annex)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  undefined4 uVar4;
  size_type sVar5;
  undefined8 uVar6;
  SigHashType *in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  ByteData256 *in_RDI;
  long in_R8;
  long in_stack_00000008;
  TapScriptData script_data;
  ByteData annex_data;
  uint32_t txin_index;
  OutPoint target_outpoint;
  value_type *txin_ref;
  size_t index;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> utxos;
  UtxoData utxo;
  ByteData256 *in_stack_fffffffffffff908;
  UtxoData *in_stack_fffffffffffff910;
  TxOut *in_stack_fffffffffffff918;
  undefined1 *puVar7;
  undefined4 in_stack_fffffffffffff920;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffff924;
  CfdException *this_00;
  SigHashType local_69c [12];
  UtxoData *in_stack_fffffffffffff970;
  UtxoData *in_stack_fffffffffffff978;
  OutPoint *in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff98c;
  ByteData local_670;
  undefined4 local_654;
  TxOut local_650;
  Script local_600;
  undefined1 local_5c2;
  undefined1 local_5c1 [49];
  Txid local_590;
  OutPoint local_570;
  const_reference local_548;
  ulong local_540;
  undefined1 local_538 [96];
  UtxoData *in_stack_fffffffffffffb28;
  Script local_4d0 [9];
  Amount local_2c8 [672];
  long local_28;
  SigHashType *local_20;
  undefined8 local_18;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  UtxoData::UtxoData(in_stack_fffffffffffff970);
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::vector
            ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)0x3b0e33);
  local_540 = 0;
  while( true ) {
    uVar1 = local_540;
    sVar5 = std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::size
                      ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)(in_RSI + 2));
    if (sVar5 <= uVar1) {
      uVar4 = (**(code **)(*in_RSI + 0x78))(in_RSI,local_18);
      local_654 = uVar4;
      cfd::core::ByteData::ByteData(&local_670);
      if (in_stack_00000008 != 0) {
        core::ByteData::operator=
                  ((ByteData *)in_stack_fffffffffffff910,(ByteData *)in_stack_fffffffffffff908);
      }
      core::TapScriptData::TapScriptData((TapScriptData *)in_stack_fffffffffffff910);
      if (local_28 != 0) {
        core::ByteData256::operator=
                  ((ByteData256 *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      }
      uVar8 = local_654;
      cfd::core::SigHashType::SigHashType(local_69c,local_20);
      if (local_28 == 0) {
        puVar7 = (undefined1 *)0x0;
      }
      else {
        puVar7 = &stack0xfffffffffffff970;
      }
      cfd::core::Transaction::GetSchnorrSignatureHash
                (in_RDI,in_RSI,uVar8,local_69c,local_538,puVar7,&local_670);
      core::TapScriptData::~TapScriptData((TapScriptData *)0x3b129b);
      core::ByteData::~ByteData((ByteData *)0x3b12a8);
      std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector
                ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)
                 CONCAT44(uVar4,uVar8));
      UtxoData::~UtxoData(in_stack_fffffffffffff910);
      return in_RDI;
    }
    local_548 = std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator[]
                          ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)(in_RSI + 2)
                           ,local_540);
    cfd::core::AbstractTxIn::GetTxid();
    uVar3 = cfd::core::AbstractTxIn::GetVout();
    cfd::core::OutPoint::OutPoint(&local_570,&local_590,uVar3);
    core::Txid::~Txid((Txid *)0x3b0edb);
    bVar2 = IsFindUtxoMap((TransactionContext *)
                          CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                          in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    if (!bVar2) break;
    GetLockingScriptFromUtxoData(in_stack_fffffffffffffb28);
    cfd::core::Script::operator=(local_4d0,&local_600);
    core::Script::~Script((Script *)in_stack_fffffffffffff910);
    cfd::core::TxOut::TxOut(&local_650,local_2c8,local_4d0);
    std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::emplace_back<cfd::core::TxOut>
              ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)
               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
               in_stack_fffffffffffff918);
    core::TxOut::~TxOut((TxOut *)0x3b10c0);
    core::OutPoint::~OutPoint((OutPoint *)0x3b10cd);
    local_540 = local_540 + 1;
  }
  local_5c2 = 1;
  uVar6 = __cxa_allocate_exception(0x30);
  this_00 = (CfdException *)local_5c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_5c1 + 1),"Utxo is not found. CreateSignatureHashByTaproot fail.",
             (allocator *)this_00);
  core::CfdException::CfdException
            (this_00,(CfdError)((ulong)uVar6 >> 0x20),
             (string *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  local_5c2 = 0;
  __cxa_throw(uVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

ByteData256 TransactionContext::CreateSignatureHashByTaproot(
    const OutPoint& outpoint, const SigHashType& sighash_type,
    const ByteData256* tap_leaf_hash, const uint32_t* code_separator_position,
    const ByteData* annex) const {
  UtxoData utxo;
  std::vector<TxOut> utxos;
  // utxos.reserve(vin_.size());
  // for (const auto& txin_ref : vin_) {
  for (size_t index = 0; index < vin_.size(); ++index) {
    const auto& txin_ref = vin_[index];
    OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    if (!IsFindUtxoMap(target_outpoint, &utxo)) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Utxo is not found. CreateSignatureHashByTaproot fail.");
    }
    utxo.locking_script = GetLockingScriptFromUtxoData(utxo);
    utxos.emplace_back(TxOut(utxo.amount, utxo.locking_script));
  }

  uint32_t txin_index = GetTxInIndex(outpoint);
  ByteData annex_data;
  if (annex != nullptr) annex_data = *annex;
  TapScriptData script_data;
  if (tap_leaf_hash != nullptr) {
    script_data.tap_leaf_hash = *tap_leaf_hash;
    if (code_separator_position != nullptr) {
      script_data.code_separator_position = *code_separator_position;
    }
  }

  return GetSchnorrSignatureHash(
      txin_index, sighash_type, utxos,
      (tap_leaf_hash != nullptr) ? &script_data : nullptr, annex_data);
}